

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldMessageAccessor::Swap
          (RepeatedPtrFieldMessageAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  undefined4 uVar1;
  undefined8 uVar2;
  LogMessage *other;
  LogFinisher local_61;
  LogMessage local_60;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_internal.h"
               ,0x157);
    other = LogMessage::operator<<(&local_60,"CHECK failed: this == other_mutator: ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
  }
  if (data != other_data) {
    if (*other_data == *data) {
      uVar2 = *(undefined8 *)((long)data + 0x10);
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)other_data + 0x10);
      *(undefined8 *)((long)other_data + 0x10) = uVar2;
      uVar1 = *(undefined4 *)((long)data + 8);
      *(undefined4 *)((long)data + 8) = *(undefined4 *)((long)other_data + 8);
      *(undefined4 *)((long)other_data + 8) = uVar1;
      uVar1 = *(undefined4 *)((long)data + 0xc);
      *(undefined4 *)((long)data + 0xc) = *(undefined4 *)((long)other_data + 0xc);
      *(undefined4 *)((long)other_data + 0xc) = uVar1;
    }
    else {
      RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                ((RepeatedPtrFieldBase *)data,(RepeatedPtrFieldBase *)other_data);
    }
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }